

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O1

void __thiscall MPEGStreamReader::fillAspectBySAR(MPEGStreamReader *this,double sar)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  uint i;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (this->m_streamAR != AR_KEEP_DEFAULT) {
    return;
  }
  uVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x14])();
  uVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x15])(this);
  this->m_streamAR = AR_KEEP_DEFAULT;
  dVar5 = 2147483647.0;
  pdVar3 = fillAspectBySAR::base_ar;
  lVar4 = 0;
  do {
    dVar6 = ABS(((double)uVar1 * sar) / (double)uVar2 - *pdVar3);
    if (dVar6 < dVar5) {
      this->m_streamAR = (VideoAspectRatio)lVar4;
      dVar5 = dVar6;
    }
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

void MPEGStreamReader::fillAspectBySAR(const double sar)
{
    if (m_streamAR == VideoAspectRatio::AR_KEEP_DEFAULT)
    {
        const double ar = getStreamWidth() * sar / static_cast<double>(getStreamHeight());
        static constexpr double base_ar[] = {0.0, 1.0, 4.0 / 3.0, 16.0 / 9.0, 221.0 / 100.0};
        double minEps = INT_MAX;
        m_streamAR = VideoAspectRatio::AR_KEEP_DEFAULT;
        for (unsigned i = 0; i < std::size(base_ar); ++i)
        {
            if (fabs(ar - base_ar[i]) < minEps)
            {
                minEps = fabs(ar - base_ar[i]);
                m_streamAR = static_cast<VideoAspectRatio>(i);
            }
        }
    }
}